

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reslist.cpp
# Opt level: O2

ArrayResource * array_open(SRBRoot *bundle,char *tag,UString *comment,UErrorCode *status)

{
  ArrayResource *this;
  
  this = (ArrayResource *)operator_new(0x50);
  ArrayResource::ArrayResource(this,bundle,tag,comment,status);
  if (U_ZERO_ERROR < *status) {
    (*(this->super_ContainerResource).super_SResource._vptr_SResource[1])(this);
    this = (ArrayResource *)0x0;
  }
  return this;
}

Assistant:

ArrayResource* array_open(struct SRBRoot *bundle, const char *tag, const struct UString* comment, UErrorCode *status) {
    LocalPointer<ArrayResource> res(new ArrayResource(bundle, tag, comment, *status), *status);
    return U_SUCCESS(*status) ? res.orphan() : NULL;
}